

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_rvi.inc.c
# Opt level: O3

_Bool trans_srliw(DisasContext_conflict12 *ctx,arg_srliw *a)

{
  undefined1 extraout_AL;
  TCGTemp *a1;
  uintptr_t o;
  TCGv_i64 pTVar1;
  uintptr_t o_1;
  TCGOpcode opc;
  uintptr_t o_2;
  TCGv_i64 ret;
  
  a1 = tcg_temp_new_internal_riscv64((TCGContext_conflict11 *)ctx,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)a1 - (long)ctx);
  if ((long)a->rs1 == 0) {
    opc = INDEX_op_movi_i64;
    pTVar1 = (TCGv_i64)0x0;
  }
  else {
    pTVar1 = (TCGv_i64)(&ctx[0x158].base.pc_next)[a->rs1];
    if (pTVar1 == ret) goto LAB_00c6df59;
    pTVar1 = pTVar1 + (long)ctx;
    opc = INDEX_op_mov_i64;
  }
  tcg_gen_op2_riscv64((TCGContext_conflict11 *)ctx,opc,(TCGArg)a1,(TCGArg)pTVar1);
LAB_00c6df59:
  tcg_gen_extract_i64_riscv64((TCGContext_conflict11 *)ctx,ret,ret,a->shamt,0x20 - a->shamt);
  tcg_gen_ext32s_i64_riscv64((TCGContext_conflict11 *)ctx,ret,ret);
  if (((long)a->rd != 0) && (pTVar1 = (TCGv_i64)(&ctx[0x158].base.pc_next)[a->rd], pTVar1 != ret)) {
    tcg_gen_op2_riscv64((TCGContext_conflict11 *)ctx,INDEX_op_mov_i64,(TCGArg)(pTVar1 + (long)ctx),
                        (TCGArg)a1);
  }
  tcg_temp_free_internal_riscv64((TCGContext_conflict11 *)ctx,(TCGTemp *)(ret + (long)ctx));
  return (_Bool)extraout_AL;
}

Assistant:

static bool trans_srliw(DisasContext *ctx, arg_srliw *a)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t = tcg_temp_new(tcg_ctx);
    gen_get_gpr(tcg_ctx, t, a->rs1);
    tcg_gen_extract_tl(tcg_ctx, t, t, a->shamt, 32 - a->shamt);
    /* sign-extend for W instructions */
    tcg_gen_ext32s_tl(tcg_ctx, t, t);
    gen_set_gpr(tcg_ctx, a->rd, t);
    tcg_temp_free(tcg_ctx, t);
    return true;
}